

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O2

void av1_thread_loop_filter_rows
               (YV12_BUFFER_CONFIG *frame_buffer,AV1_COMMON *cm,macroblockd_plane *planes,
               MACROBLOCKD *xd,int mi_row,int plane,int dir,int lpf_opt_level,AV1LfSync *lf_sync,
               aom_internal_error_info *error_info,AV1_DEBLOCKING_PARAMETERS *params_buf,
               TX_SIZE *tx_buf,int num_mis_in_lpf_unit_height_log2)

{
  _Bool _Var1;
  int iVar2;
  bool joint_filter_chroma;
  int r;
  int iVar3;
  uint32_t uVar4;
  int c;
  
  iVar2 = (cm->mi_params).mi_cols;
  r = mi_row >> ((byte)num_mis_in_lpf_unit_height_log2 & 0x1f);
  joint_filter_chroma = 0 < plane && lpf_opt_level == 2;
  if (dir == 0) {
    iVar3 = iVar2 + 0x1f;
    c = 0;
    for (uVar4 = 0; (int)uVar4 < iVar2; uVar4 = uVar4 + 0x20) {
      av1_setup_dst_planes
                (planes,cm->seq_params->sb_size,frame_buffer,mi_row,uVar4,plane,
                 joint_filter_chroma + 1 + plane);
      if (lpf_opt_level == 0) {
        av1_filter_block_plane_vert(cm,xd,plane,planes + plane,mi_row,uVar4);
      }
      else if (plane == 0) {
        av1_filter_block_plane_vert_opt
                  (cm,xd,planes,mi_row,uVar4,params_buf,tx_buf,num_mis_in_lpf_unit_height_log2);
      }
      else {
        av1_filter_block_plane_vert_opt_chroma
                  (cm,xd,planes + plane,mi_row,uVar4,params_buf,tx_buf,plane,joint_filter_chroma,
                   num_mis_in_lpf_unit_height_log2);
      }
      if (lf_sync != (AV1LfSync *)0x0) {
        sync_write(lf_sync,r,c,iVar3 >> 5,plane);
      }
      iVar2 = (cm->mi_params).mi_cols;
      c = c + 1;
    }
  }
  else if (dir == 1) {
    iVar3 = 0;
    for (uVar4 = 0; (int)uVar4 < iVar2; uVar4 = uVar4 + 0x20) {
      if (lf_sync != (AV1LfSync *)0x0) {
        sync_read(lf_sync,r,iVar3,plane);
        sync_read(lf_sync,r + 1,iVar3,plane);
        if (1 < lf_sync->num_workers) {
          pthread_mutex_lock((pthread_mutex_t *)lf_sync->job_mutex);
          _Var1 = lf_sync->lf_mt_exit;
          pthread_mutex_unlock((pthread_mutex_t *)lf_sync->job_mutex);
          if (_Var1 != false) {
            return;
          }
        }
      }
      av1_setup_dst_planes
                (planes,cm->seq_params->sb_size,frame_buffer,mi_row,uVar4,plane,
                 joint_filter_chroma + 1 + plane);
      if (lpf_opt_level == 0) {
        av1_filter_block_plane_horz(cm,xd,plane,planes + plane,mi_row,uVar4);
      }
      else if (plane == 0) {
        av1_filter_block_plane_horz_opt
                  (cm,xd,planes,mi_row,uVar4,params_buf,tx_buf,num_mis_in_lpf_unit_height_log2);
      }
      else {
        av1_filter_block_plane_horz_opt_chroma
                  (cm,xd,planes + plane,mi_row,uVar4,params_buf,tx_buf,plane,joint_filter_chroma,
                   num_mis_in_lpf_unit_height_log2);
      }
      iVar2 = (cm->mi_params).mi_cols;
      iVar3 = iVar3 + 1;
    }
  }
  return;
}

Assistant:

void av1_thread_loop_filter_rows(
    const YV12_BUFFER_CONFIG *const frame_buffer, AV1_COMMON *const cm,
    struct macroblockd_plane *planes, MACROBLOCKD *xd, int mi_row, int plane,
    int dir, int lpf_opt_level, AV1LfSync *const lf_sync,
    struct aom_internal_error_info *error_info,
    AV1_DEBLOCKING_PARAMETERS *params_buf, TX_SIZE *tx_buf,
    int num_mis_in_lpf_unit_height_log2) {
  // TODO(aomedia:3276): Pass error_info to the low-level functions as required
  // in future to handle error propagation.
  (void)error_info;
  const int sb_cols =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_cols, MAX_MIB_SIZE_LOG2);
  const int r = mi_row >> num_mis_in_lpf_unit_height_log2;
  int mi_col, c;

  const bool joint_filter_chroma = (lpf_opt_level == 2) && plane > AOM_PLANE_Y;
  const int num_planes = joint_filter_chroma ? 2 : 1;
  assert(IMPLIES(joint_filter_chroma, plane == AOM_PLANE_U));

  if (dir == 0) {
    for (mi_col = 0; mi_col < cm->mi_params.mi_cols; mi_col += MAX_MIB_SIZE) {
      c = mi_col >> MAX_MIB_SIZE_LOG2;

      av1_setup_dst_planes(planes, cm->seq_params->sb_size, frame_buffer,
                           mi_row, mi_col, plane, plane + num_planes);
      if (lpf_opt_level) {
        if (plane == AOM_PLANE_Y) {
          av1_filter_block_plane_vert_opt(cm, xd, &planes[plane], mi_row,
                                          mi_col, params_buf, tx_buf,
                                          num_mis_in_lpf_unit_height_log2);
        } else {
          av1_filter_block_plane_vert_opt_chroma(
              cm, xd, &planes[plane], mi_row, mi_col, params_buf, tx_buf, plane,
              joint_filter_chroma, num_mis_in_lpf_unit_height_log2);
        }
      } else {
        av1_filter_block_plane_vert(cm, xd, plane, &planes[plane], mi_row,
                                    mi_col);
      }
      if (lf_sync != NULL) {
        sync_write(lf_sync, r, c, sb_cols, plane);
      }
    }
  } else if (dir == 1) {
    for (mi_col = 0; mi_col < cm->mi_params.mi_cols; mi_col += MAX_MIB_SIZE) {
      c = mi_col >> MAX_MIB_SIZE_LOG2;

      if (lf_sync != NULL) {
        // Wait for vertical edge filtering of the top-right block to be
        // completed
        sync_read(lf_sync, r, c, plane);

        // Wait for vertical edge filtering of the right block to be completed
        sync_read(lf_sync, r + 1, c, plane);
      }

#if CONFIG_MULTITHREAD
      if (lf_sync && lf_sync->num_workers > 1) {
        pthread_mutex_lock(lf_sync->job_mutex);
        const bool lf_mt_exit = lf_sync->lf_mt_exit;
        pthread_mutex_unlock(lf_sync->job_mutex);
        // Exit in case any worker has encountered an error.
        if (lf_mt_exit) return;
      }
#endif

      av1_setup_dst_planes(planes, cm->seq_params->sb_size, frame_buffer,
                           mi_row, mi_col, plane, plane + num_planes);
      if (lpf_opt_level) {
        if (plane == AOM_PLANE_Y) {
          av1_filter_block_plane_horz_opt(cm, xd, &planes[plane], mi_row,
                                          mi_col, params_buf, tx_buf,
                                          num_mis_in_lpf_unit_height_log2);
        } else {
          av1_filter_block_plane_horz_opt_chroma(
              cm, xd, &planes[plane], mi_row, mi_col, params_buf, tx_buf, plane,
              joint_filter_chroma, num_mis_in_lpf_unit_height_log2);
        }
      } else {
        av1_filter_block_plane_horz(cm, xd, plane, &planes[plane], mi_row,
                                    mi_col);
      }
    }
  }
}